

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O2

int Dau_CountSymms(word t,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int j;
  int i;
  word Cof1;
  word Cof0;
  word local_48;
  word local_40;
  word local_38;
  
  iVar2 = 0;
  if (0 < nVars) {
    iVar2 = nVars;
  }
  iVar3 = 0;
  iVar1 = 0;
  local_48 = t;
  while (i = iVar1, i != iVar2) {
    for (j = i + 1; iVar1 = i + 1, j < nVars; j = j + 1) {
      iVar1 = Abc_TtVarsAreSymmetric(&local_48,nVars,i,j,&local_38,&local_40);
      iVar3 = iVar3 + iVar1;
    }
  }
  return iVar3;
}

Assistant:

int Dau_CountSymms( word t, int nVars )
{
    word Cof0, Cof1;
    int i, j, nPairs = 0;
    for ( i = 0; i < nVars; i++ )
    for ( j = i+1; j < nVars; j++ )
        nPairs += Abc_TtVarsAreSymmetric(&t, nVars, i, j, &Cof0, &Cof1);
    return nPairs;
}